

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O0

JavascriptError * __thiscall
Js::JavascriptError::CloneErrorMsgAndNumber
          (JavascriptError *this,JavascriptLibrary *targetJavascriptLibrary)

{
  PCWSTR message;
  LPCWSTR pError;
  int iVar1;
  HRESULT hr_00;
  undefined4 extraout_var;
  ScriptContext *scriptContext;
  PCWSTR pWStack_28;
  HRESULT hr;
  LPCWSTR msg;
  JavascriptError *jsNewError;
  JavascriptLibrary *targetJavascriptLibrary_local;
  JavascriptError *this_local;
  
  jsNewError = (JavascriptError *)targetJavascriptLibrary;
  targetJavascriptLibrary_local = (JavascriptLibrary *)this;
  iVar1 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6c])
                    (this,targetJavascriptLibrary);
  msg = (LPCWSTR)CONCAT44(extraout_var,iVar1);
  if (msg != (LPCWSTR)0x0) {
    pWStack_28 = (PCWSTR)0x0;
    hr_00 = GetRuntimeError((RecyclableObject *)this,&stack0xffffffffffffffd8);
    pError = msg;
    message = pWStack_28;
    scriptContext = JavascriptLibrary::GetScriptContext((JavascriptLibrary *)jsNewError);
    SetErrorMessageProperties((JavascriptError *)pError,hr_00,message,scriptContext);
  }
  return (JavascriptError *)msg;
}

Assistant:

JavascriptError* JavascriptError::CloneErrorMsgAndNumber(JavascriptLibrary* targetJavascriptLibrary)
    {
        JavascriptError* jsNewError = this->CreateNewErrorOfSameType(targetJavascriptLibrary);
        if (jsNewError)
        {
            LPCWSTR msg = nullptr;
            HRESULT hr = JavascriptError::GetRuntimeError(this, &msg);
            jsNewError->SetErrorMessageProperties(jsNewError, hr, msg, targetJavascriptLibrary->GetScriptContext());
        }
        return jsNewError;
    }